

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_34;
  char *pcStack_30;
  int i;
  char *dir;
  int old_leaks;
  int old_tests;
  int old_errors;
  int ret;
  char **argv_local;
  int argc_local;
  
  pcStack_30 = "xmlconf";
  logfile = (FILE *)fopen64("runxmlconf.log","wb");
  if ((FILE *)logfile == (FILE *)0x0) {
    fprintf(_stderr,"Could not open the log file, running in verbose mode\n");
    verbose = 1;
  }
  initializeLibxml2();
  local_34 = 1;
  do {
    iVar2 = nb_leaks;
    iVar1 = nb_tests;
    iVar3 = nb_errors;
    if (argc <= local_34) {
      xmlconfTest(pcStack_30);
      if ((nb_errors == iVar3) && (nb_leaks == iVar2)) {
        printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar1));
      }
      else {
        printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar1),
               (ulong)(uint)(nb_errors - iVar3),(ulong)(uint)(nb_leaks - iVar2));
      }
      if ((nb_errors == 0) && (nb_leaks == 0)) {
        old_tests = 0;
        printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
      }
      else {
        old_tests = 1;
        printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,
               (ulong)(uint)nb_leaks);
        printf("See %s for detailed output\n","runxmlconf.log");
        if ((nb_leaks == 0) && (nb_errors == 0xf)) {
          printf("%d errors were expected\n",0xf);
          old_tests = 0;
        }
      }
      xmlXPathFreeContext(ctxtXPath);
      xmlCleanupParser();
      if (logfile != (FILE *)0x0) {
        fclose((FILE *)logfile);
      }
      return old_tests;
    }
    iVar3 = strcmp(argv[local_34],"-v");
    if (iVar3 == 0) {
      verbose = 1;
    }
    else {
      iVar3 = strcmp(argv[local_34],"-d");
      if ((iVar3 != 0) || (argc <= local_34 + 1)) {
        fprintf(_stderr,"invalid argument: %s\n",argv[local_34]);
        return 1;
      }
      local_34 = local_34 + 1;
      pcStack_30 = argv[local_34];
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int
main(int argc, char **argv) {
    int ret = 0;
    int old_errors, old_tests, old_leaks;
    const char *dir = "xmlconf";
    int i;

    logfile = fopen(LOGFILE, "wb");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            verbose = 1;
        } else if (strcmp(argv[i], "-d") == 0 && i + 1 < argc) {
            i += 1;
            dir = argv[i];
        } else {
            fprintf(stderr, "invalid argument: %s\n", argv[i]);
            return 1;
        }
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xmlconfTest(dir);
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
	ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
	printf("See %s for detailed output\n", LOGFILE);
	if ((nb_leaks == 0) && (nb_errors == NB_EXPECTED_ERRORS)) {
	    printf("%d errors were expected\n", nb_errors);
	    ret = 0;
	}
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}